

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

bool __thiscall MultivariateTracker::update(MultivariateTracker *this,DataVector *data)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  pointer pSVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  pointer pSVar11;
  pointer pDVar12;
  double dVar13;
  double dVar14;
  
  lVar5 = (long)(this->_statistics).
                super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->_statistics).
                super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar5 == 0) {
    lVar5 = (long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar5 != 0) {
      initialize(this,lVar5 >> 4,&this->_options);
      pDVar12 = (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                super__Vector_impl_data._M_start;
      goto LAB_0018d91f;
    }
  }
  else {
    pDVar12 = (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
              super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
              super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pDVar12 >> 4 ==
        (lVar5 >> 3) * 0x34f72c234f72c235) {
LAB_0018d91f:
      if (((this->_options).doCov == true) &&
         (uVar4 = (uint)((ulong)((long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                                       super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pDVar12) >>
                        4), 0 < (int)uVar4)) {
        pSVar11 = (this->_statistics).
                  super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar6 = (ulong)(uVar4 & 0x7fffffff);
        lVar5 = 0;
        uVar8 = 0;
        do {
          if (pDVar12[uVar8].active == true) {
            dVar1 = pDVar12[uVar8].value;
            dVar2 = pSVar11[uVar8]._mean;
            dVar13 = (double)((int)pSVar11[uVar8]._count + 1);
            pdVar3 = (this->_covariance).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start;
            uVar10 = 0;
            pSVar7 = pSVar11;
            pdVar9 = &pDVar12->value;
            do {
              if (((DataPoint *)(pdVar9 + -1))->active == true) {
                dVar14 = (double)((int)pSVar7->_count + 1);
                if (dVar14 <= dVar13) {
                  dVar14 = dVar13;
                }
                *(double *)((long)pdVar3 + uVar10 * 8 + lVar5) =
                     (((dVar14 + -1.0) / dVar14) * (dVar1 - dVar2) * (*pdVar9 - pSVar7->_mean) +
                     *(double *)((long)pdVar3 + uVar10 * 8 + lVar5) * (dVar14 + -1.0)) / dVar14;
              }
              uVar10 = uVar10 + 1;
              pdVar9 = pdVar9 + 2;
              pSVar7 = pSVar7 + 1;
            } while (uVar6 != uVar10);
          }
          uVar8 = uVar8 + 1;
          lVar5 = lVar5 + uVar6 * 8;
        } while (uVar8 != uVar6);
      }
      pSVar11 = (this->_statistics).
                super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar7 = (this->_statistics).
               super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pSVar11 == pSVar7) {
        return true;
      }
      pdVar9 = &pDVar12->value;
      do {
        if (((DataPoint *)(pdVar9 + -1))->active == true) {
          StatisticsTracker::update(pSVar11,*pdVar9);
          pSVar7 = (this->_statistics).
                   super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        }
        pSVar11 = pSVar11 + 1;
        pdVar9 = pdVar9 + 2;
      } while (pSVar11 != pSVar7);
      return true;
    }
  }
  return false;
}

Assistant:

bool
    update(DataVector const & data)
    {

        // Check data dimensions matches tracker dimensions
        if (this->_statistics.size() != 0 && data.size() != this->_statistics.size())
        {
            return false;
        }

        // Try to initialize the tracker
        if (this->_statistics.size() == 0)
        {
            if (data.size() == 0) return false;
            this->initialize(data.size(), this->_options);
        }

        if (this->_options.doCov)
        {

            // Update covariance
            const int numPoints = data.size();
            for (int i = 0; i < numPoints; i++)
            {
            
                if (!data[i].active) continue;

                int countI = this->_statistics[i].getCount();
                double meanI = this->_statistics[i].getMean();
                double deltaI = (data[i].value - meanI);

                for (int j = 0; j < numPoints; j++)
                {

                    if (!data[j].active) continue;
                
                    int countJ = this->_statistics[j].getCount();
                    double meanJ = this->_statistics[j].getMean();
                    double deltaJ = (data[j].value - meanJ);

                    // Conservative estimate the number of data points
                    double N = std::max<double>(countI+1, countJ+1);

                    int k = i * numPoints + j;
                    this->_covariance[k] *= (N-1);
                    this->_covariance[k] += ((N-1)/N) * (deltaI) * (deltaJ);
                    this->_covariance[k] /= N;

                }
            }

        }

        // Update statistics with each data point
        DataVector::const_iterator datum = data.begin();
        std::vector<StatisticsTracker>::iterator tracker = this->_statistics.begin();
        for ( ; tracker != this->_statistics.end(); ++tracker, ++datum)
        {
            if (datum->active) tracker->update(datum->value);
        }

        return true;
        
    }